

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void quality_menu(char *unused,wchar_t also_unused)

{
  undefined1 auStack_108 [8];
  region_conflict area;
  menu_iter menu_f;
  undefined1 local_c8 [8];
  menu_conflict menu;
  wchar_t also_unused_local;
  char *unused_local;
  
  area.width = 0;
  area.page_rows = 0;
  auStack_108._0_4_ = 0;
  auStack_108._4_4_ = 0;
  area.col = 0;
  area.row = 0;
  menu._172_4_ = also_unused;
  screen_save();
  clear_from(L'\0');
  menu_init((menu_conflict *)local_c8,MN_SKIN_SCROLL,(menu_iter *)&area.width);
  menu.header = "Quality ignore menu";
  menu_setpriv((menu_conflict *)local_c8,0x19,quality_values);
  menu_layout((menu_conflict *)local_c8,(region_conflict *)auStack_108);
  menu_select((menu_conflict *)local_c8,0,false);
  screen_load();
  return;
}

Assistant:

static void quality_menu(const char *unused, int also_unused)
{
	struct menu menu;
	menu_iter menu_f = { NULL, quality_validity, quality_display,
						 quality_action, NULL };
	region area = { 0, 0, 0, 0 };

	/* Save screen */
	screen_save();
	clear_from(0);

	/* Set up the menu */
	menu_init(&menu, MN_SKIN_SCROLL, &menu_f);
	menu.title = "Quality ignore menu";
	menu_setpriv(&menu, ITYPE_MAX, quality_values);
	menu_layout(&menu, &area);

	/* Select an entry */
	menu_select(&menu, 0, false);

	/* Load screen */
	screen_load();
	return;
}